

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O2

int check_byte_orderings(test_state *state)

{
  uint *puVar1;
  int iVar2;
  
  puts("-----------------------------------");
  puts("Checking no PP, LSB first, unsigned");
  puts("-----------------------------------");
  iVar2 = check_bps(state);
  if (iVar2 == 0) {
    puts("-----------------------------------");
    puts("Checking PP, LSB first, unsigned");
    puts("-----------------------------------");
    puVar1 = &state->strm->flags;
    *puVar1 = *puVar1 | 8;
    iVar2 = check_bps(state);
    if (iVar2 == 0) {
      puts("-----------------------------------");
      puts("Checking PP, LSB first, signed");
      puts("-----------------------------------");
      puVar1 = &state->strm->flags;
      *puVar1 = *puVar1 | 1;
      iVar2 = check_bps(state);
      if (iVar2 == 0) {
        state->strm->flags = state->strm->flags & 0xfffffffa | 4;
        puts("-----------------------------------");
        puts("Checking PP, MSB first, unsigned");
        puts("-----------------------------------");
        iVar2 = check_bps(state);
        if (iVar2 == 0) {
          puts("-----------------------------------");
          puts("Checking PP, MSB first, signed");
          puts("-----------------------------------");
          puVar1 = &state->strm->flags;
          *puVar1 = *puVar1 | 1;
          iVar2 = check_bps(state);
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int check_byte_orderings(struct test_state *state)
{
    int status;

    printf("-----------------------------------\n");
    printf("Checking no PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_PREPROCESS;
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, signed\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_SIGNED;

    status = check_bps(state);
    if (status)
        return status;

    state->strm->flags &= ~AEC_DATA_SIGNED;
    state->strm->flags |= AEC_DATA_MSB;

    printf("-----------------------------------\n");
    printf("Checking PP, MSB first, unsigned\n");
    printf("-----------------------------------\n");
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, MSB first, signed\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_SIGNED;

    status = check_bps(state);
    if (status)
        return status;
    return 0;
}